

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O0

int __thiscall libnbt::NBTTagVector<long>::remove(NBTTagVector<long> *this,char *__filename)

{
  char *pcVar1;
  bool bVar2;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_38;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_30;
  const_iterator local_28;
  char *local_20;
  size_t index_local;
  NBTTagVector<long> *this_local;
  
  local_20 = __filename;
  index_local = (size_t)this;
  pcVar1 = (char *)std::vector<long,_std::allocator<long>_>::size(&this->array);
  bVar2 = __filename < pcVar1;
  if (bVar2) {
    local_38._M_current = (long *)std::vector<long,_std::allocator<long>_>::begin(&this->array);
    local_30 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator+(&local_38,(difference_type)local_20);
    __gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>::
    __normal_iterator<long*>
              ((__normal_iterator<long_const*,std::vector<long,std::allocator<long>>> *)&local_28,
               &local_30);
    __filename = (char *)std::vector<long,_std::allocator<long>_>::erase(&this->array,local_28);
  }
  return (int)CONCAT71((int7)((ulong)__filename >> 8),bVar2);
}

Assistant:

virtual bool remove(size_t index) {
            if (index < array.size()) {
                array.erase(array.begin() + index);
                return true;
            }
            return false;
        }